

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  int *piVar14;
  float *pfVar15;
  float *pfVar16;
  double *pdVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  float *pfVar25;
  float *pfVar26;
  int k;
  int j;
  long lVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM5_Qb;
  
  pfVar9 = this->gPartials[parIndex];
  pfVar10 = this->gStateFrequencies[stateFrequenciesIndex];
  pfVar11 = this->gTransitionMatrices[probIndex];
  pfVar12 = this->gTransitionMatrices[firstDerivativeIndex];
  pfVar13 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  if ((childIndex < this->kTipCount) &&
     (piVar14 = this->gTipStates[childIndex], piVar14 != (int *)0x0)) {
    uVar4 = this->kPatternCount;
    uVar5 = this->kCategoryCount;
    lVar24 = 0;
    for (uVar23 = 0; uVar23 != (~((int)uVar5 >> 0x1f) & uVar5); uVar23 = uVar23 + 1) {
      uVar6 = this->kStateCount;
      iVar7 = this->kPartialsPaddedStateCount;
      lVar24 = (long)(int)lVar24;
      lVar27 = 0;
      fVar1 = pfVar13[uVar23];
      pfVar25 = pfVar9 + lVar24;
      iVar8 = this->kMatrixSize;
      for (uVar20 = 0; uVar20 != (~((int)uVar4 >> 0x1f) & uVar4); uVar20 = uVar20 + 1) {
        lVar27 = (long)(int)lVar27;
        pfVar26 = this->integrationTmp;
        iVar19 = this->kTransPaddedStateCount;
        pfVar15 = this->firstDerivTmp;
        lVar21 = (long)piVar14[uVar20] + (long)(iVar8 * (int)uVar23);
        for (uVar22 = 0; (~((int)uVar6 >> 0x1f) & uVar6) != uVar22; uVar22 = uVar22 + 1) {
          auVar29 = ZEXT416((uint)fVar1);
          auVar30 = vfmadd213ss_fma(ZEXT416((uint)(pfVar11[lVar21] * pfVar25[uVar22])),auVar29,
                                    ZEXT416((uint)pfVar26[lVar27 + uVar22]));
          pfVar26[lVar27 + uVar22] = auVar30._0_4_;
          pfVar16 = pfVar12 + lVar21;
          lVar21 = lVar21 + iVar19;
          auVar30 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar16 * pfVar25[uVar22])),auVar29,
                                    ZEXT416((uint)pfVar15[lVar27 + uVar22]));
          pfVar15[lVar27 + uVar22] = auVar30._0_4_;
        }
        lVar24 = lVar24 + iVar7;
        pfVar25 = pfVar25 + iVar7;
        lVar27 = lVar27 + uVar22;
      }
    }
  }
  else {
    lVar24 = 0;
    pfVar25 = this->gPartials[childIndex];
    uVar4 = this->kCategoryCount;
    uVar5 = this->kPatternCount;
    for (uVar23 = 0; uVar23 != (~((int)uVar4 >> 0x1f) & uVar4); uVar23 = uVar23 + 1) {
      uVar6 = this->kStateCount;
      auVar30._0_8_ = (double)pfVar13[uVar23];
      auVar30._8_8_ = in_ZMM1._8_8_;
      iVar7 = this->kPartialsPaddedStateCount;
      lVar24 = (long)(int)lVar24;
      pfVar26 = pfVar25 + lVar24;
      lVar27 = 0;
      iVar8 = this->kMatrixSize;
      for (uVar18 = 0; uVar18 != (~((int)uVar5 >> 0x1f) & uVar5); uVar18 = uVar18 + 1) {
        pfVar15 = this->integrationTmp;
        pfVar16 = this->firstDerivTmp;
        lVar27 = (long)(int)lVar27;
        uVar20 = 0;
        iVar19 = iVar8 * (int)uVar23;
        while (uVar20 != (~((int)uVar6 >> 0x1f) & uVar6)) {
          dVar28 = 0.0;
          dVar33 = 0.0;
          for (uVar22 = 0; uVar6 != uVar22; uVar22 = uVar22 + 1) {
            dVar28 = dVar28 + (double)(pfVar26[uVar22] * pfVar11[(long)iVar19 + uVar22]);
            dVar33 = dVar33 + (double)(pfVar26[uVar22] * pfVar12[(long)iVar19 + uVar22]);
          }
          iVar19 = iVar19 + uVar6 + 1;
          auVar37._0_8_ = (double)pfVar15[lVar27];
          auVar37._8_8_ = in_XMM5_Qb;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar28 * (double)pfVar9[lVar24 + uVar20];
          auVar29 = vfmadd231sd_fma(auVar37,auVar30,auVar36);
          pfVar15[lVar27] = (float)auVar29._0_8_;
          lVar21 = lVar24 + uVar20;
          auVar38._0_8_ = (double)pfVar16[lVar27];
          auVar38._8_8_ = in_XMM5_Qb;
          uVar20 = uVar20 + 1;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = dVar33 * (double)pfVar9[lVar21];
          auVar29 = vfmadd231sd_fma(auVar38,auVar30,auVar29);
          in_ZMM3 = ZEXT1664(auVar29);
          in_ZMM1 = ZEXT1664(CONCAT124(auVar29._4_12_,(float)auVar29._0_8_));
          pfVar16[lVar27] = (float)auVar29._0_8_;
          lVar27 = lVar27 + 1;
        }
        pfVar26 = pfVar26 + iVar7;
        lVar24 = lVar24 + iVar7;
      }
    }
  }
  lVar24 = 0;
  for (lVar27 = 0; uVar4 = this->kPatternCount, lVar27 < (int)uVar4; lVar27 = lVar27 + 1) {
    lVar24 = (long)(int)lVar24;
    auVar30 = ZEXT816(0) << 0x40;
    auVar29 = ZEXT816(0) << 0x40;
    uVar23 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
    for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
      auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)pfVar10[uVar20]),
                                ZEXT416((uint)this->integrationTmp[lVar24 + uVar20]));
      auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)pfVar10[uVar20]),
                                ZEXT416((uint)this->firstDerivTmp[lVar24 + uVar20]));
    }
    lVar24 = lVar24 + uVar23;
    dVar28 = log((double)auVar30._0_4_);
    this->outLogLikelihoodsTmp[lVar27] = (float)dVar28;
    this->outFirstDerivativesTmp[lVar27] = auVar29._0_4_ / auVar30._0_4_;
  }
  if (scalingFactorsIndex == -1) {
    uVar23 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
  }
  else {
    pfVar9 = this->outLogLikelihoodsTmp;
    pfVar10 = this->gScaleBuffers[scalingFactorsIndex];
    uVar23 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
    for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
      pfVar9[uVar20] = pfVar10[uVar20] + pfVar9[uVar20];
    }
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  uVar20 = 0;
  pdVar17 = this->gPatternWeights;
  pfVar9 = this->outLogLikelihoodsTmp;
  pfVar10 = this->outFirstDerivativesTmp;
  while (uVar23 != uVar20) {
    auVar31._0_8_ = (double)pfVar9[uVar20];
    auVar31._8_8_ = in_ZMM3._8_8_;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = pdVar17[uVar20];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *outSumLogLikelihood;
    auVar30 = vfmadd213sd_fma(auVar34,auVar31,auVar2);
    *outSumLogLikelihood = auVar30._0_8_;
    auVar32._0_8_ = (double)pfVar10[uVar20];
    auVar32._8_8_ = in_ZMM3._8_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = pdVar17[uVar20];
    uVar20 = uVar20 + 1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *outSumFirstDerivative;
    auVar30 = vfmadd213sd_fma(auVar35,auVar32,auVar3);
    *outSumFirstDerivative = auVar30._0_8_;
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}